

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_internal_impl.hpp
# Opt level: O1

iter_result * __thiscall
unodb::detail::
basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
::last(iter_result *__return_storage_ptr__,
      basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,_std::span<const_std::byte,_18446744073709551615UL>,_unodb::db,_unodb::in_fake_critical_section,_unodb::fake_lock,_unodb::fake_read_critical_section,_unodb::detail::basic_node_ptr<unodb::detail::node_header>,_unodb::detail::inode_defs,_unodb::detail::db_inode_deleter,_unodb::detail::basic_db_leaf_deleter>_>
      *this)

{
  undefined1 uVar1;
  ulong uVar2;
  byte bVar3;
  ulong uVar4;
  
  if ((this->child_indexes)._M_elems[0xff].value == 0xff) {
    bVar3 = 0xff;
    uVar2 = 0xfe;
    do {
      uVar4 = uVar2;
      if (uVar4 == 0xffffffffffffffff) goto LAB_001a42b0;
      bVar3 = bVar3 - 1;
      uVar2 = uVar4 - 1;
    } while ((this->child_indexes)._M_elems[uVar4 & 0xff].value == 0xff);
    (__return_storage_ptr__->node).tagged_ptr = (ulong)this | 3;
    __return_storage_ptr__->key_byte = bVar3;
    __return_storage_ptr__->child_index = bVar3;
    uVar1 = this->field_0x7;
    *(key_prefix_data *)&__return_storage_ptr__->prefix =
         (key_prefix_data)*(undefined7 *)&this->field_0x0;
    *(undefined1 *)((long)&__return_storage_ptr__->prefix + 7) = uVar1;
    if (uVar4 == 0xffffffffffffffff) {
LAB_001a42b0:
      basic_inode_48<unodb::detail::basic_art_policy<unsigned_long,std::span<std::byte_const,18446744073709551615ul>,unodb::db,unodb::in_fake_critical_section,unodb::fake_lock,unodb::fake_read_critical_section,unodb::detail::basic_node_ptr<unodb::detail::node_header>,unodb::detail::inode_defs,unodb::detail::db_inode_deleter,unodb::detail::basic_db_leaf_deleter>>
      ::last();
    }
  }
  else {
    (__return_storage_ptr__->node).tagged_ptr = (ulong)this | 3;
    __return_storage_ptr__->key_byte = 0xff;
    __return_storage_ptr__->child_index = 0xff;
    uVar1 = this->field_0x7;
    *(key_prefix_data *)&__return_storage_ptr__->prefix =
         (key_prefix_data)*(undefined7 *)&this->field_0x0;
    *(undefined1 *)((long)&__return_storage_ptr__->prefix + 7) = uVar1;
  }
  return __return_storage_ptr__;
}

Assistant:

[[nodiscard, gnu::pure]] constexpr typename basic_inode_48::iter_result
  last() noexcept {
    for (std::int64_t i = 255; i >= 0; i--) {
      if (child_indexes[static_cast<std::uint8_t>(i)] != empty_child) {
        const auto key = static_cast<std::byte>(i);
        const auto child_index = static_cast<std::uint8_t>(i);
        return {node_ptr{this, node_type::I48}, key, child_index,
                this->get_key_prefix().get_snapshot()};
      }
    }
    // because we always have at least 17 keys.
    UNODB_DETAIL_CANNOT_HAPPEN();  // LCOV_EXCL_LINE
  }